

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O0

bool is_valid(test_utf8_char s)

{
  test_utf8_char s_00;
  test_utf8_char s_01;
  int iVar1;
  const_pointer s_02;
  undefined1 auStack_20 [7];
  bool valid;
  test_utf8_char s_local;
  
  s_local._M_len = (size_t)s._M_str;
  _auStack_20 = s._M_len;
  s_02 = std::basic_string_view<char,_std::char_traits<char>_>::data
                   ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  iVar1 = cm_utf8_is_valid(s_02);
  if (iVar1 != 0) {
    s_00._M_str = (char *)s_local._M_len;
    s_00._M_len = _auStack_20;
    report_valid(true,s_00);
    printf("valid as expected\n");
  }
  else {
    s_01._M_str = (char *)s_local._M_len;
    s_01._M_len = _auStack_20;
    report_valid(false,s_01);
    printf("expected valid, reported as invalid\n");
  }
  return iVar1 != 0;
}

Assistant:

static bool is_valid(test_utf8_char s)
{
  bool valid = cm_utf8_is_valid(s.data()) != 0;
  if (!valid) {
    report_valid(false, s);
    printf("expected valid, reported as invalid\n");
    return false;
  }
  report_valid(true, s);
  printf("valid as expected\n");
  return true;
}